

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O3

int ZIP_seek(PHYSFS_Io *_io,PHYSFS_uint64 offset)

{
  ushort uVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  undefined4 *puVar6;
  ulong uVar7;
  long lVar8;
  PHYSFS_ErrorCode errcode;
  uint uVar9;
  PHYSFS_uint8 buf [512];
  undefined1 local_238 [520];
  
  plVar2 = (long *)_io->opaque;
  lVar3 = *plVar2;
  if (*(ulong *)(lVar3 + 0x58) < offset) {
    errcode = PHYSFS_ERR_PAST_EOF;
LAB_00118e72:
    PHYSFS_setErrorCode(errcode);
  }
  else {
    lVar4 = plVar2[1];
    uVar1 = *(ushort *)(lVar3 + 0x44);
    if (((uVar1 & 1) == 0) && (*(short *)(lVar3 + 0x46) == 0)) {
      iVar5 = (**(code **)(lVar4 + 0x20))(lVar4,*(long *)(lVar3 + 0x38) + offset);
      if (iVar5 == 0) {
        return 0;
      }
      *(int *)((long)plVar2 + 0x14) = (int)offset;
      return 1;
    }
    if (offset < *(uint *)((long)plVar2 + 0x14)) {
      puVar6 = (undefined4 *)(*__PHYSFS_AllocatorHooks.Malloc)(0xab10);
      if (puVar6 == (undefined4 *)0x0) {
        errcode = PHYSFS_ERR_OUT_OF_MEMORY;
        goto LAB_00118e72;
      }
      *puVar6 = 0;
      puVar6[0x2ac3] = 1;
      *(undefined8 *)(puVar6 + 0xabe) = 0;
      *(undefined8 *)(puVar6 + 0xac0) = 1;
      puVar6[0xac2] = 0xfffffff1;
      PHYSFS_setErrorCode(PHYSFS_ERR_OK);
      lVar8 = 0xc;
      if ((uVar1 & 1) == 0) {
        lVar8 = 0;
      }
      iVar5 = (**(code **)(lVar4 + 0x20))(lVar4,lVar8 + *(long *)(lVar3 + 0x38));
      if (iVar5 == 0) {
        return 0;
      }
      if (plVar2[0xe] != 0) {
        (*(code *)plVar2[0x10])(plVar2[0x11]);
      }
      plVar2[0xb] = 0;
      plVar2[0xc] = 0;
      plVar2[9] = 0;
      plVar2[10] = 0;
      plVar2[7] = 0;
      plVar2[8] = 0;
      plVar2[0xd] = 0;
      plVar2[0xe] = (long)puVar6;
      plVar2[0xf] = (long)zlibPhysfsAlloc;
      plVar2[0x10] = (long)zlibPhysfsFree;
      plVar2[0x11] = (long)&__PHYSFS_AllocatorHooks;
      plVar2[2] = 0;
      plVar2[0x12] = 0;
      plVar2[0x13] = 0;
      plVar2[0x14] = 0;
      if ((uVar1 & 1) != 0) {
        *(undefined4 *)(plVar2 + 5) = *(undefined4 *)((long)plVar2 + 0x34);
        plVar2[4] = *(long *)((long)plVar2 + 0x2c);
      }
    }
    do {
      if (*(uint *)((long)plVar2 + 0x14) == offset) {
        return 1;
      }
      uVar9 = (int)offset - *(uint *)((long)plVar2 + 0x14);
      if (0x1ff < uVar9) {
        uVar9 = 0x200;
      }
      uVar7 = ZIP_read(_io,local_238,(ulong)uVar9);
    } while (uVar7 == uVar9);
  }
  return 0;
}

Assistant:

static int ZIP_seek(PHYSFS_Io *_io, PHYSFS_uint64 offset)
{
    ZIPfileinfo *finfo = (ZIPfileinfo *) _io->opaque;
    ZIPentry *entry = finfo->entry;
    PHYSFS_Io *io = finfo->io;
    const int encrypted = zip_entry_is_tradional_crypto(entry);

    BAIL_IF(offset > entry->uncompressed_size, PHYSFS_ERR_PAST_EOF, 0);

    if (!encrypted && (entry->compression_method == COMPMETH_NONE))
    {
        PHYSFS_sint64 newpos = offset + entry->offset;
        BAIL_IF_ERRPASS(!io->seek(io, newpos), 0);
        finfo->uncompressed_position = (PHYSFS_uint32) offset;
    } /* if */

    else
    {
        /*
         * If seeking backwards, we need to redecode the file
         *  from the start and throw away the compressed bits until we hit
         *  the offset we need. If seeking forward, we still need to
         *  decode, but we don't rewind first.
         */
        if (offset < finfo->uncompressed_position)
        {
            /* we do a copy so state is sane if inflateInit2() fails. */
            z_stream str;
            initializeZStream(&str);
            if (zlib_err(inflateInit2(&str, -MAX_WBITS)) != Z_OK)
                return 0;

            if (!io->seek(io, entry->offset + (encrypted ? 12 : 0)))
                return 0;

            inflateEnd(&finfo->stream);
            memcpy(&finfo->stream, &str, sizeof (z_stream));
            finfo->uncompressed_position = finfo->compressed_position = 0;

            if (encrypted)
                memcpy(finfo->crypto_keys, finfo->initial_crypto_keys, 12);
        } /* if */

        while (finfo->uncompressed_position != offset)
        {
            PHYSFS_uint8 buf[512];
            PHYSFS_uint32 maxread;

            maxread = (PHYSFS_uint32) (offset - finfo->uncompressed_position);
            if (maxread > sizeof (buf))
                maxread = sizeof (buf);

            if (ZIP_read(_io, buf, maxread) != maxread)
                return 0;
        } /* while */
    } /* else */

    return 1;
}